

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.cpp
# Opt level: O1

void __thiscall
libtorrent::anon_unknown_5::bits_shift_right(anon_unknown_5 *this,span<unsigned_int> number,int n)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = (int)number.m_len;
  iVar6 = iVar5 + 0x1f;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  uVar3 = iVar6 >> 5;
  iVar6 = (int)number.m_ptr;
  if (iVar6 - uVar3 != 0 && (int)uVar3 <= iVar6) {
    if (0x1f < iVar5) {
      memmove(this + (ulong)uVar3 * 4,this,(long)(int)(iVar6 - uVar3) << 2);
      memset(this,0,(ulong)uVar3 << 2);
      iVar5 = iVar5 + uVar3 * -0x20;
    }
    if (0 < iVar5) {
      uVar3 = *(uint *)(this + (long)iVar6 * 4 + -4);
      *(uint *)(this + (long)iVar6 * 4 + -4) =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      bVar1 = (byte)iVar5;
      if (1 < iVar6) {
        uVar3 = *(uint *)(this + (ulong)(iVar6 - 1) * 4);
        lVar2 = (ulong)(iVar6 - 1) + 1;
        do {
          uVar4 = uVar3 >> (bVar1 & 0x1f);
          uVar3 = *(uint *)(this + lVar2 * 4 + -8);
          uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
          *(uint *)(this + lVar2 * 4 + -8) = uVar3;
          uVar4 = uVar3 << (0x20 - bVar1 & 0x1f) | uVar4;
          *(uint *)(this + lVar2 * 4 + -4) =
               uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          lVar2 = lVar2 + -1;
        } while (1 < lVar2);
      }
      uVar3 = *(uint *)this >> (bVar1 & 0x1f);
      *(uint *)this =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    }
    return;
  }
  memset(this,0,(long)number.m_ptr << 2);
  return;
}

Assistant:

void bits_shift_right(span<std::uint32_t> const number, int n) noexcept
	{
		TORRENT_ASSERT(n >= 0);
		int const num_words = n / 32;
		int const number_size = int(number.size());
		if (num_words >= number_size)
		{
			std::memset(number.data(), 0, std::size_t(number.size() * 4));
			return;
		}
		if (num_words > 0)
		{
			std::memmove(number.data() + num_words
				, number.data(), std::size_t(number_size - num_words) * sizeof(std::uint32_t));
			std::memset(number.data(), 0, std::size_t(num_words) * sizeof(std::uint32_t));
			n -= num_words * 32;
		}
		if (n > 0)
		{
			// keep in mind that the uint32_t are stored in network
			// byte order, so they have to be byteswapped before
			// applying the shift operations, and then byteswapped
			// back again.
			number[number_size - 1] = aux::network_to_host(number[number_size - 1]);

			for (int i = number_size - 1; i > 0; --i)
			{
				number[i] >>= n;
				number[i - 1] = aux::network_to_host(number[i - 1]);
				number[i] |= (number[i - 1] << (32 - n)) & 0xffffffff;
				number[i] = aux::host_to_network(number[i]);
			}
			number[0] >>= n;
			number[0] = aux::host_to_network(number[0]);
		}
	}